

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  float fVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  undefined4 uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  istream *piVar11;
  ostream *poVar12;
  undefined8 *puVar13;
  long *plVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Array3f phi_grid;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  undefined4 uStack_8d4;
  int padding;
  float dx;
  Vec<3U,_float> local_8c8;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> faceList;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> vertList;
  string line;
  Vec3ui sizes;
  int v2;
  undefined4 uStack_84c;
  long local_848;
  ulong local_840 [2];
  ios_base *local_830;
  string outname;
  int v1;
  undefined4 uStack_804;
  long local_800;
  ulong local_7f8 [2];
  long *local_7e8;
  size_t local_7e0;
  long local_7d8 [2];
  long *local_7c8;
  size_t local_7c0;
  long local_7b8 [2];
  long *local_7a8;
  size_t local_7a0;
  long local_798 [2];
  string filename;
  long *local_768;
  size_t local_760;
  long local_758 [2];
  ofstream outfile;
  float fStack_744;
  size_t sStack_740;
  long local_738;
  undefined8 uStack_730;
  ios_base local_6c8 [120];
  ios_base local_650 [264];
  ifstream infile;
  long local_538 [2];
  byte abStack_528 [488];
  stringstream arg3;
  ios_base aiStack_2c0 [264];
  stringstream arg2;
  ios_base aiStack_138 [264];
  
  if (argc != 4) {
    std::operator<<((ostream *)&std::cout,
                    "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\nThe output file format is:");
    std::operator<<((ostream *)&std::cout,"<ni> <nj> <nk>\n");
    std::operator<<((ostream *)&std::cout,"<origin_x> <origin_y> <origin_z>\n");
    std::operator<<((ostream *)&std::cout,"<dx>\n");
    std::operator<<((ostream *)&std::cout,"<value_1> <value_2> <value_3> [...]\n\n");
    std::operator<<((ostream *)&std::cout,
                    "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n");
    std::operator<<((ostream *)&std::cout,"<dx> is the grid spacing.\n\n");
    std::operator<<((ostream *)&std::cout,
                    "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"Usage: SDFGen <filename> <dx> <padding>\n\n");
    std::operator<<((ostream *)&std::cout,"Where:\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "\t<dx> specifies the length of grid cell in the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n"
                   );
LAB_0010467a:
    exit(-1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,argv[1],(allocator<char> *)&infile);
  bVar16 = true;
  if (4 < filename._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_7a8,(ulong)&filename);
    local_768 = local_758;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,".obj","");
    if (local_7a0 == local_760) {
      if (local_7a0 == 0) {
        bVar16 = false;
      }
      else {
        iVar9 = bcmp(local_7a8,local_768,local_7a0);
        bVar16 = iVar9 != 0;
      }
    }
  }
  if (4 < filename._M_string_length) {
    if (local_768 != local_758) {
      operator_delete(local_768,local_758[0] + 1);
    }
    if (local_7a8 != local_798) {
      operator_delete(local_7a8,local_798[0] + 1);
    }
  }
  if (bVar16) {
    std::operator<<((ostream *)&std::cerr,
                    "Error: Expected OBJ file with filename of the form <name>.obj.\n");
    goto LAB_0010467a;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,argv[2],(allocator<char> *)&outfile);
  std::__cxx11::stringstream::stringstream((stringstream *)&arg2,(string *)&infile,_S_out|_S_in);
  if (_infile != local_538) {
    operator_delete(_infile,local_538[0] + 1);
  }
  std::istream::_M_extract<float>((float *)&arg2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,argv[3],(allocator<char> *)&outfile);
  std::__cxx11::stringstream::stringstream((stringstream *)&arg3,(string *)&infile,_S_out|_S_in);
  if (_infile != local_538) {
    operator_delete(_infile,local_538[0] + 1);
  }
  std::istream::operator>>((istream *)&arg3,&padding);
  if (padding < 1) {
    padding = 1;
  }
  auVar28._8_4_ = 0x7f7fffff;
  auVar28._0_8_ = 0x7f7fffff7f7fffff;
  auVar28._12_4_ = 0x7f7fffff;
  local_8e0 = (undefined1  [8])vmovlps_avx(auVar28);
  fStack_8d8 = 3.4028235e+38;
  auVar29._8_4_ = 0xff7fffff;
  auVar29._0_8_ = 0xff7fffffff7fffff;
  auVar29._12_4_ = 0xff7fffff;
  local_8c8.v._0_8_ = vmovlps_avx(auVar29);
  local_8c8.v[2] = -3.4028235e+38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading data.\n",0xe);
  std::ifstream::ifstream(&infile,argv[1],_S_in);
  if ((abStack_528[_infile[-3]] & 5) != 0) {
    std::operator<<((ostream *)&std::cerr,"Failed to open. Terminating.\n");
    goto LAB_0010467a;
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  iVar9 = 0;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = _infile[-3];
  if ((abStack_528[lVar1] & 2) == 0) {
    local_830 = local_6c8;
    iVar9 = 0;
    do {
      cVar8 = std::ios::widen((char)&phi_grid + (char)lVar1 + -0x40);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&infile,(string *)&line,cVar8);
      std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
      phi_grid._0_8_ = &phi_grid.a;
      std::__cxx11::string::_M_construct<char_const*>((string *)&phi_grid,"v","");
      if (sStack_740 == CONCAT44(phi_grid._12_4_,phi_grid.nk)) {
        if (sStack_740 == 0) {
          bVar16 = true;
        }
        else {
          iVar10 = bcmp(_outfile,(void *)phi_grid._0_8_,sStack_740);
          bVar16 = iVar10 == 0;
        }
      }
      else {
        bVar16 = false;
      }
      if (bVar16) {
        std::__cxx11::string::substr((ulong)&local_7e8,(ulong)&line);
        local_7c8 = local_7b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"vn","");
        bVar17 = true;
        if (local_7e0 == local_7c0) {
          if (local_7e0 == 0) goto LAB_00103886;
          iVar10 = bcmp(local_7e8,local_7c8,local_7e0);
          bVar17 = iVar10 != 0;
        }
      }
      else {
LAB_00103886:
        bVar17 = false;
      }
      if (bVar16) {
        if (local_7c8 != local_7b8) {
          operator_delete(local_7c8,local_7b8[0] + 1);
        }
        if (local_7e8 != local_7d8) {
          operator_delete(local_7e8,local_7d8[0] + 1);
        }
      }
      if ((Array1<float> *)phi_grid._0_8_ != &phi_grid.a) {
        operator_delete((void *)phi_grid._0_8_,phi_grid.a.n + 1);
      }
      if (_outfile != &local_738) {
        operator_delete(_outfile,local_738 + 1);
      }
      if (bVar17) {
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&outfile,(string *)&line,_S_out|_S_in);
        piVar11 = std::operator>>((istream *)&outfile,(char *)&outname);
        piVar11 = std::istream::_M_extract<float>((float *)piVar11);
        piVar11 = std::istream::_M_extract<float>((float *)piVar11);
        std::istream::_M_extract<float>((float *)piVar11);
        if (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec<3u,float>,std::allocator<Vec<3u,float>>>::
          _M_realloc_insert<Vec<3u,float>const&>
                    ((vector<Vec<3u,float>,std::allocator<Vec<3u,float>>> *)&vertList,
                     (iterator)
                     vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Vec<3U,_float> *)&phi_grid);
        }
        else {
          (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->v[2] = (float)phi_grid.nk;
          (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->v[0] = (float)phi_grid.ni;
          (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
           super__Vector_impl_data._M_finish)->v[1] = (float)phi_grid.nj;
          vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        auVar19._8_4_ = phi_grid.nk;
        auVar19._0_4_ = phi_grid.ni;
        auVar19._4_4_ = phi_grid.nj;
        auVar19._12_4_ = 0;
        auVar20._0_12_ = local_8e0._0_12_;
        auVar20._12_4_ = 0;
        uVar4 = vcmpps_avx512vl(auVar19,auVar20,1);
        bVar6 = (byte)uVar4;
        bVar5 = ~bVar6 & 7;
        auVar21._4_4_ = (uint)(bVar5 >> 1 & 1) * (int)local_8c8.v[1];
        auVar21._0_4_ = (uint)(~bVar6 & 1) * (int)local_8c8.v[0];
        auVar21._8_4_ = (uint)(bVar5 >> 2) * (int)local_8c8.v[2];
        auVar21._12_4_ = 0;
        uVar18 = vcmpps_avx512vl(auVar21,auVar19,1);
        uVar18 = bVar5 & uVar18;
        bVar16 = (bool)((byte)uVar18 & 1);
        bVar17 = (bool)((byte)(uVar18 >> 1) & 1);
        bVar2 = SUB81(uVar18 >> 2,0);
        local_8c8.v[2] = (float)((uint)bVar2 * phi_grid.nk | (uint)!bVar2 * (int)local_8c8.v[2]);
        local_8c8.v[1] = (float)((uint)bVar17 * phi_grid.nj | (uint)!bVar17 * (int)local_8c8.v[1]);
        local_8c8.v[0] = (float)((uint)bVar16 * phi_grid.ni | (uint)!bVar16 * (int)local_8c8.v[0]);
        bVar16 = (bool)((bVar6 & 7) >> 1 & 1);
        bVar17 = (bool)((bVar6 & 7) >> 2);
        local_8e0._4_4_ = (uint)bVar16 * phi_grid.nj | (uint)!bVar16 * local_8e0._4_4_;
        local_8e0._0_4_ =
             (uint)(bVar6 & 1) * phi_grid.ni | (uint)!(bool)(bVar6 & 1) * local_8e0._0_4_;
        fStack_8d8 = (float)((uint)bVar17 * phi_grid.nk | (uint)!bVar17 * (int)fStack_8d8);
LAB_00103bcf:
        std::__cxx11::stringstream::~stringstream((stringstream *)&outfile);
        std::ios_base::~ios_base(local_830);
      }
      else {
        std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
        phi_grid._0_8_ = &phi_grid.a;
        std::__cxx11::string::_M_construct<char_const*>((string *)&phi_grid,"f","");
        if (sStack_740 == CONCAT44(phi_grid._12_4_,phi_grid.nk)) {
          if (sStack_740 == 0) {
            bVar16 = true;
          }
          else {
            iVar10 = bcmp(_outfile,(void *)phi_grid._0_8_,sStack_740);
            bVar16 = iVar10 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((Array1<float> *)phi_grid._0_8_ != &phi_grid.a) {
          operator_delete((void *)phi_grid._0_8_,phi_grid.a.n + 1);
        }
        if (_outfile != &local_738) {
          operator_delete(_outfile,local_738 + 1);
        }
        if (bVar16) {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&outfile,(string *)&line,_S_out|_S_in);
          piVar11 = std::operator>>((istream *)&outfile,(char *)&sizes);
          piVar11 = (istream *)std::istream::operator>>(piVar11,(int *)&outname);
          piVar11 = (istream *)std::istream::operator>>(piVar11,&v1);
          std::istream::operator>>(piVar11,&v2);
          phi_grid.ni = (int)outname._M_dataplus._M_p + -1;
          phi_grid.nj = v1 + -1;
          phi_grid.nk = v2 - 1;
          if (faceList.
              super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              faceList.
              super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Vec<3u,unsigned_int>,std::allocator<Vec<3u,unsigned_int>>>::
            _M_realloc_insert<Vec<3u,unsigned_int>>
                      ((vector<Vec<3u,unsigned_int>,std::allocator<Vec<3u,unsigned_int>>> *)
                       &faceList,
                       (iterator)
                       faceList.
                       super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Vec<3U,_unsigned_int> *)&phi_grid
                      );
          }
          else {
            (faceList.
             super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->v[2] = phi_grid.nk;
            *(ulong *)(faceList.
                       super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->v =
                 CONCAT44(phi_grid.nj,phi_grid.ni);
            faceList.
            super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 faceList.
                 super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          goto LAB_00103bcf;
        }
        std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
        phi_grid._0_8_ = &phi_grid.a;
        std::__cxx11::string::_M_construct<char_const*>((string *)&phi_grid,"vn","");
        if (sStack_740 == CONCAT44(phi_grid._12_4_,phi_grid.nk)) {
          if (sStack_740 == 0) {
            bVar16 = true;
          }
          else {
            iVar10 = bcmp(_outfile,(void *)phi_grid._0_8_,sStack_740);
            bVar16 = iVar10 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((Array1<float> *)phi_grid._0_8_ != &phi_grid.a) {
          operator_delete((void *)phi_grid._0_8_,phi_grid.a.n + 1);
        }
        if (_outfile != &local_738) {
          operator_delete(_outfile,local_738 + 1);
        }
        if (bVar16) {
          std::operator<<((ostream *)&std::cerr,
                          "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n"
                         );
          exit(-2);
        }
        iVar9 = iVar9 + 1;
      }
      lVar1 = _infile[-3];
    } while ((abStack_528[lVar1] & 2) == 0);
  }
  std::ifstream::close();
  if (0 < iVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warning: ",9);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," lines were ignored since they did not contain faces or vertices.\n",0x42);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read in ",8);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," vertices and ",0xe);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," faces.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  uVar7 = sStack_740._4_4_;
  auVar30._4_4_ = dx;
  auVar30._0_4_ = dx;
  auVar30._8_4_ = dx;
  auVar30._12_4_ = dx;
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  fVar3 = dx * (float)padding;
  uVar4 = vmovlps_avx(auVar31);
  _outfile = (float)uVar4;
  fStack_744 = (float)((ulong)uVar4 >> 0x20);
  fStack_744 = fVar3 * fStack_744;
  _outfile = fVar3 * _outfile;
  sStack_740._0_4_ = fVar3 * 1.0;
  auVar22._12_4_ = 0;
  auVar22._0_12_ = _outfile;
  auVar23._0_12_ = local_8e0._0_12_;
  auVar23._12_4_ = 0;
  auVar28 = vsubps_avx(auVar23,auVar22);
  _local_8e0 = auVar28._0_12_;
  uVar4 = vmovlps_avx(auVar31);
  _outfile = (float)uVar4;
  fStack_744 = (float)((ulong)uVar4 >> 0x20);
  _outfile = fVar3 * _outfile;
  fStack_744 = fVar3 * fStack_744;
  local_8c8.v[0] = _outfile + local_8c8.v[0];
  local_8c8.v[1] = fStack_744 + local_8c8.v[1];
  local_8c8.v[2] = fVar3 * 1.0 + local_8c8.v[2];
  sStack_740._0_4_ = local_8c8.v[2];
  _outfile = local_8c8.v[0];
  fStack_744 = local_8c8.v[1];
  auVar24._12_4_ = 0;
  auVar24._0_12_ = (undefined1  [12])_local_8e0;
  auVar25._0_12_ = outfile._0_12_;
  auVar25._12_4_ = 0;
  auVar28 = vsubps_avx(auVar25,auVar24);
  auVar26._0_12_ = auVar28._0_12_;
  auVar26._12_4_ = 0;
  auVar28 = vdivps_avx(auVar26,auVar30);
  auVar27._0_12_ = auVar28._0_12_;
  _outfile = auVar27._0_12_;
  _outfile = CONCAT412(uVar7,_outfile);
  auVar27._12_4_ = 0;
  auVar28 = vcvttps2udq_avx512vl(auVar27);
  auVar28 = vmovdqu32_avx512vl(auVar28);
  sizes.v[0] = auVar28._0_4_;
  sizes.v[1] = auVar28._4_4_;
  sizes.v[2] = auVar28._8_4_;
  v2 = auVar28._12_4_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bound box size: (",0x11)
  ;
  poVar12 = operator<<((ostream *)&std::cout,(Vec<3U,_float> *)local_8e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") to (",6);
  poVar12 = operator<<(poVar12,&local_8c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") with dimensions ",0x12);
  poVar12 = operator<<(poVar12,&sizes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Computing signed distance field.\n",0x21);
  phi_grid.ni = 0;
  phi_grid.nj = 0;
  phi_grid.nk = 0;
  phi_grid.a.n = 0;
  phi_grid.a.max_n = 0;
  phi_grid.a.data = (float *)0x0;
  make_level_set3(&faceList,&vertList,(Vec3f *)local_8e0,dx,sizes.v[0],sizes.v[1],sizes.v[2],
                  &phi_grid,1);
  outname._M_string_length = 0;
  outname.field_2._M_local_buf[0] = '\0';
  outname._M_dataplus._M_p = (pointer)&outname.field_2;
  std::__cxx11::string::substr((ulong)&v1,(ulong)&filename);
  v2 = (int)local_840;
  uStack_84c = (undefined4)((ulong)local_840 >> 0x20);
  std::__cxx11::string::_M_construct<char_const*>((string *)&v2,".sdf","");
  uVar18 = 0xf;
  if ((ulong *)CONCAT44(uStack_804,v1) != local_7f8) {
    uVar18 = local_7f8[0];
  }
  if (uVar18 < (ulong)(local_848 + local_800)) {
    uVar18 = 0xf;
    if ((ulong *)CONCAT44(uStack_84c,v2) != local_840) {
      uVar18 = local_840[0];
    }
    if ((ulong)(local_848 + local_800) <= uVar18) {
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&v2,0,(char *)0x0,CONCAT44(uStack_804,v1));
      goto LAB_001040f5;
    }
  }
  puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&v1,CONCAT44(uStack_84c,v2));
LAB_001040f5:
  _outfile = &local_738;
  plVar14 = puVar13 + 2;
  if ((long *)*puVar13 == plVar14) {
    local_738 = *plVar14;
    uStack_730 = puVar13[3];
  }
  else {
    local_738 = *plVar14;
    _outfile = (long *)*puVar13;
  }
  sStack_740 = puVar13[1];
  *puVar13 = plVar14;
  puVar13[1] = 0;
  *(undefined1 *)plVar14 = 0;
  std::__cxx11::string::operator=((string *)&outname,(string *)&outfile);
  if (_outfile != &local_738) {
    operator_delete(_outfile,local_738 + 1);
  }
  if ((ulong *)CONCAT44(uStack_84c,v2) != local_840) {
    operator_delete((ulong *)CONCAT44(uStack_84c,v2),local_840[0] + 1);
  }
  if ((ulong *)CONCAT44(uStack_804,v1) != local_7f8) {
    operator_delete((ulong *)CONCAT44(uStack_804,v1),local_7f8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing results to: ",0x14);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,outname._M_dataplus._M_p,outname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  std::ofstream::ofstream(&outfile,outname._M_dataplus._M_p,_S_out);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)&outfile,phi_grid.ni);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,phi_grid.nj);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  plVar14 = (long *)std::ostream::operator<<((ostream *)poVar12,phi_grid.nk);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  poVar12 = std::ostream::_M_insert<double>((double)(float)local_8e0._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = std::ostream::_M_insert<double>((double)(float)local_8e0._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = std::ostream::_M_insert<double>((double)fStack_8d8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  poVar12 = std::ostream::_M_insert<double>((double)dx);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  if (phi_grid.a.n != 0) {
    uVar18 = 0;
    uVar15 = 1;
    do {
      poVar12 = std::ostream::_M_insert<double>((double)phi_grid.a.data[uVar18]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      bVar16 = uVar15 < phi_grid.a.n;
      uVar18 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar16);
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Processing complete.\n",0x15);
  _outfile = (long *)_VTT;
  *(undefined8 *)(&outfile + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&sStack_740);
  std::ios_base::~ios_base(local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outname._M_dataplus._M_p != &outname.field_2) {
    operator_delete(outname._M_dataplus._M_p,
                    CONCAT71(outname.field_2._M_allocated_capacity._1_7_,
                             outname.field_2._M_local_buf[0]) + 1);
  }
  phi_grid.ni = 0;
  phi_grid.nj = 0;
  free(phi_grid.a.data);
  phi_grid.a.data = (float *)0x0;
  phi_grid.a._0_16_ = ZEXT816(0);
  if (faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceList.
                    super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)faceList.
                          super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)faceList.
                          super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vertList.
                          super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertList.
                          super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line._M_dataplus._M_p != &line.field_2) {
    operator_delete(line._M_dataplus._M_p,
                    CONCAT71(line.field_2._M_allocated_capacity._1_7_,line.field_2._M_local_buf[0])
                    + 1);
  }
  std::ifstream::~ifstream(&infile);
  std::__cxx11::stringstream::~stringstream((stringstream *)&arg3);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&arg2);
  std::ios_base::~ios_base(aiStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  
  if(argc != 4) {
    std::cout << "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n";
    std::cout << "\nThe output file format is:";
    std::cout << "<ni> <nj> <nk>\n";
    std::cout << "<origin_x> <origin_y> <origin_z>\n";
    std::cout << "<dx>\n";
    std::cout << "<value_1> <value_2> <value_3> [...]\n\n";
    
    std::cout << "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n";
    std::cout << "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n";
    std::cout << "<dx> is the grid spacing.\n\n";
    std::cout << "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n";

    std::cout << "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n";

    std::cout << "Usage: SDFGen <filename> <dx> <padding>\n\n";
    std::cout << "Where:\n";
    std::cout << "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n";
    std::cout << "\t<dx> specifies the length of grid cell in the resulting distance field.\n";
    std::cout << "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n";
    
    exit(-1);
  }

  std::string filename(argv[1]);
  if(filename.size() < 5 || filename.substr(filename.size()-4) != std::string(".obj")) {
    std::cerr << "Error: Expected OBJ file with filename of the form <name>.obj.\n";
    exit(-1);
  }

  std::stringstream arg2(argv[2]);
  float dx;
  arg2 >> dx;
  
  std::stringstream arg3(argv[3]);
  int padding;
  arg3 >> padding;

  if(padding < 1) padding = 1;
  //start with a massive inside out bound box.
  Vec3f min_box(std::numeric_limits<float>::max(),std::numeric_limits<float>::max(),std::numeric_limits<float>::max()), 
    max_box(-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max());
  
  std::cout << "Reading data.\n";

  std::ifstream infile(argv[1]);
  if(!infile) {
    std::cerr << "Failed to open. Terminating.\n";
    exit(-1);
  }

  int ignored_lines = 0;
  std::string line;
  std::vector<Vec3f> vertList;
  std::vector<Vec3ui> faceList;
  while(!infile.eof()) {
    std::getline(infile, line);

    //.obj files sometimes contain vertex normals indicated by "vn"
    if(line.substr(0,1) == std::string("v") && line.substr(0,2) != std::string("vn")){
      std::stringstream data(line);
      char c;
      Vec3f point;
      data >> c >> point[0] >> point[1] >> point[2];
      vertList.push_back(point);
      update_minmax(point, min_box, max_box);
    }
    else if(line.substr(0,1) == std::string("f")) {
      std::stringstream data(line);
      char c;
      int v0,v1,v2;
      data >> c >> v0 >> v1 >> v2;
      faceList.push_back(Vec3ui(v0-1,v1-1,v2-1));
    }
    else if( line.substr(0,2) == std::string("vn") ){
      std::cerr << "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n";
      exit(-2); 
    }
    else {
      ++ignored_lines; 
    }
  }
  infile.close();
  
  if(ignored_lines > 0)
    std::cout << "Warning: " << ignored_lines << " lines were ignored since they did not contain faces or vertices.\n";

  std::cout << "Read in " << vertList.size() << " vertices and " << faceList.size() << " faces." << std::endl;

  //Add padding around the box.
  Vec3f unit(1,1,1);
  min_box -= padding*dx*unit;
  max_box += padding*dx*unit;
  Vec3ui sizes = Vec3ui((max_box - min_box)/dx);
  
  std::cout << "Bound box size: (" << min_box << ") to (" << max_box << ") with dimensions " << sizes << "." << std::endl;

  std::cout << "Computing signed distance field.\n";
  Array3f phi_grid;
  make_level_set3(faceList, vertList, min_box, dx, sizes[0], sizes[1], sizes[2], phi_grid);

  std::string outname;

  #ifdef HAVE_VTK
    // If compiled with VTK, we can directly output a volumetric image format instead
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".vti");
    std::cout << "Writing results to: " << outname << "\n";
    vtkSmartPointer<vtkImageData> output_volume = vtkSmartPointer<vtkImageData>::New();

    output_volume->SetDimensions(phi_grid.ni ,phi_grid.nj ,phi_grid.nk);
    output_volume->SetOrigin( phi_grid.ni*dx/2, phi_grid.nj*dx/2,phi_grid.nk*dx/2);
    output_volume->SetSpacing(dx,dx,dx);

    vtkSmartPointer<vtkFloatArray> distance = vtkSmartPointer<vtkFloatArray>::New();
    
    distance->SetNumberOfTuples(phi_grid.a.size());
    
    output_volume->GetPointData()->AddArray(distance);
    distance->SetName("Distance");

    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      distance->SetValue(i, phi_grid.a[i]);
    }

    vtkSmartPointer<vtkXMLImageDataWriter> writer =
    vtkSmartPointer<vtkXMLImageDataWriter>::New();
    writer->SetFileName(outname.c_str());

    #if VTK_MAJOR_VERSION <= 5
      writer->SetInput(output_volume);
    #else
      writer->SetInputData(output_volume);
    #endif
    writer->Write();

  #else
    // if VTK support is missing, default back to the original ascii file-dump.
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".sdf");
    std::cout << "Writing results to: " << outname << "\n";
    
    std::ofstream outfile( outname.c_str());
    outfile << phi_grid.ni << " " << phi_grid.nj << " " << phi_grid.nk << std::endl;
    outfile << min_box[0] << " " << min_box[1] << " " << min_box[2] << std::endl;
    outfile << dx << std::endl;
    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      outfile << phi_grid.a[i] << std::endl;
    }
    outfile.close();
  #endif

  std::cout << "Processing complete.\n";

return 0;
}